

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::Array<kj::HttpByteRange>::~Array(Array<kj::HttpByteRange> *this)

{
  HttpByteRange *pHVar1;
  size_t sVar2;
  
  pHVar1 = this->ptr;
  if (pHVar1 != (HttpByteRange *)0x0) {
    sVar2 = this->size_;
    this->ptr = (HttpByteRange *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pHVar1,0x10,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }